

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

PacketBuilder * __thiscall PacketBuilder::AddChar(PacketBuilder *this,uchar num)

{
  undefined7 in_register_00000031;
  
  PacketProcessor::ENumber((uint)CONCAT71(in_register_00000031,num));
  std::__cxx11::string::push_back((char)this + '\b');
  return this;
}

Assistant:

PacketBuilder &PacketBuilder::AddChar(unsigned char num)
{
#ifdef DEBUG
	std::size_t capacity_before = this->Capacity();
#endif

	this->data += PacketProcessor::ENumber(num)[0];

#ifdef DEBUG
	if (this->data.length() > capacity_before)
		debug_packetbuilder_overflow(this, capacity_before);
#endif

	return *this;
}